

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O2

int gcm_mask(mbedtls_gcm_context *ctx,uchar *ectr,size_t offset,size_t use_len,uchar *input,
            uchar *output)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  size_t olen;
  
  olen = 0;
  iVar2 = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,ectr,&olen);
  if (iVar2 == 0) {
    lVar1 = offset + 0x178;
    if (ctx->mode == '\0') {
      uVar3 = 0;
      while (uVar3 + 8 <= use_len) {
        *(ulong *)(ctx->buf + uVar3 + lVar1 + -0x178) =
             *(ulong *)(ctx->buf + uVar3 + lVar1 + -0x178) ^ *(ulong *)(input + uVar3);
        uVar3 = uVar3 + 8;
      }
      for (; uVar3 < use_len; uVar3 = uVar3 + 1) {
        ctx->buf[uVar3 + lVar1 + -0x178] = ctx->buf[uVar3 + lVar1 + -0x178] ^ input[uVar3];
      }
    }
    uVar3 = 0;
    while (uVar3 + 8 <= use_len) {
      *(ulong *)(output + uVar3) = *(ulong *)(input + uVar3) ^ *(ulong *)(ectr + uVar3 + offset);
      uVar3 = uVar3 + 8;
    }
    for (; uVar3 < use_len; uVar3 = uVar3 + 1) {
      output[uVar3] = input[uVar3] ^ ectr[uVar3 + offset];
    }
    if (ctx->mode == '\x01') {
      uVar3 = 0;
      while (uVar3 + 8 <= use_len) {
        *(ulong *)(ctx->buf + uVar3 + lVar1 + -0x178) =
             *(ulong *)(ctx->buf + uVar3 + lVar1 + -0x178) ^ *(ulong *)(output + uVar3);
        uVar3 = uVar3 + 8;
      }
      for (; uVar3 < use_len; uVar3 = uVar3 + 1) {
        ctx->buf[uVar3 + lVar1 + -0x178] = ctx->buf[uVar3 + lVar1 + -0x178] ^ output[uVar3];
      }
    }
    iVar2 = 0;
  }
  else {
    mbedtls_platform_zeroize(ectr,0x10);
  }
  return iVar2;
}

Assistant:

static int gcm_mask(mbedtls_gcm_context *ctx,
                    unsigned char ectr[16],
                    size_t offset, size_t use_len,
                    const unsigned char *input,
                    unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    ret = mbedtls_block_cipher_encrypt(&ctx->block_cipher_ctx, ctx->y, ectr);
#else
    size_t olen = 0;
    ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->y, 16, ectr, &olen);
#endif
    if (ret != 0) {
        mbedtls_platform_zeroize(ectr, 16);
        return ret;
    }

    if (ctx->mode == MBEDTLS_GCM_DECRYPT) {
        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, input, use_len);
    }
    mbedtls_xor(output, ectr + offset, input, use_len);
    if (ctx->mode == MBEDTLS_GCM_ENCRYPT) {
        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, output, use_len);
    }

    return 0;
}